

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>
::val(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>
      *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  *pFVar4;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar5;
  FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
  *pFVar6;
  double dVar7;
  double dVar8;
  
  pFVar4 = (((this->left_->fadexpr_).left_)->fadexpr_).expr_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  dVar1 = (pFVar5->fadexpr_).left_.constant_;
  dVar2 = (*(Fad<double> **)((long)&pFVar5->fadexpr_ + 0x10))->val_;
  dVar3 = (pFVar4->fadexpr_).right_.constant_;
  pFVar6 = (this->left_->fadexpr_).right_;
  pFVar5 = (pFVar6->fadexpr_).expr_.fadexpr_.left_;
  dVar7 = cos(((pFVar5->fadexpr_).left_.constant_ * ((pFVar5->fadexpr_).right_)->val_) /
              (pFVar6->fadexpr_).expr_.fadexpr_.right_.constant_);
  dVar8 = sin((this->right_->fadexpr_).expr_.fadexpr_.left_.constant_ -
              ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  return dVar8 * dVar7 * ((-dVar1 * dVar2) / dVar3);
}

Assistant:

const value_type val() const {return left_.val() * right_.val() ;}